

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

TokenList * scanTokens(void)

{
  char *pcVar1;
  int iVar2;
  TokenList *pTVar3;
  TokenList *pTVar4;
  TokenList *pTVar5;
  int iVar6;
  TokenList *pTVar7;
  TokenType local_50;
  undefined8 local_4c;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 uStack_38;
  
  scanToken();
  if (local_50 == TOKEN_EOF) {
    pTVar7 = (TokenList *)0x0;
    pTVar4 = (TokenList *)0x0;
  }
  else {
    pTVar7 = (TokenList *)0x0;
    pTVar5 = (TokenList *)0x0;
    do {
      pTVar4 = (TokenList *)malloc(0x28);
      (pTVar4->value).type = local_50;
      *(undefined8 *)&(pTVar4->value).field_0x4 = local_4c;
      *(ulong *)((long)&(pTVar4->value).start + 4) = CONCAT44(uStack_40,uStack_44);
      (pTVar4->value).file = (char *)CONCAT44(uStack_3c,uStack_40);
      (pTVar4->value).length = (undefined4)uStack_38;
      (pTVar4->value).line = uStack_38._4_4_;
      pTVar4->next = (TokenList *)0x0;
      pTVar3 = pTVar4;
      if (pTVar7 != (TokenList *)0x0) {
        pTVar5->next = pTVar4;
        pTVar3 = pTVar7;
      }
      pTVar7 = pTVar3;
      scanToken();
      pTVar5 = pTVar4;
    } while (local_50 != TOKEN_EOF);
  }
  iVar2 = scanner_3;
  pcVar1 = scanner_1;
  iVar6 = scanner_2 - (int)scanner_1;
  pTVar5 = (TokenList *)malloc(0x28);
  (pTVar5->value).type = TOKEN_EOF;
  (pTVar5->value).start = pcVar1;
  (pTVar5->value).length = iVar6;
  (pTVar5->value).line = iVar2;
  pTVar5->next = (TokenList *)0x0;
  if (pTVar7 != (TokenList *)0x0) {
    pTVar4->next = pTVar5;
    pTVar5 = pTVar7;
  }
  return pTVar5;
}

Assistant:

TokenList* scanTokens(){
    TokenList *ret = NULL, *head = NULL;
    Token t;
    while((t = scanToken()).type != TOKEN_EOF){
        //info("Looping in makelist");
        insertList(&head, &ret, newList(t));
    }

    insertList(&head, &ret, newList(makeToken(TOKEN_EOF)));

    return head;
}